

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

roaring_bitmap_t *
roaring_bitmap_flip_closed(roaring_bitmap_t *x1,uint32_t range_start,uint32_t range_end)

{
  _Bool cow;
  uint in_EDX;
  uint in_ESI;
  roaring_bitmap_t *in_RDI;
  uint32_t hb;
  uint16_t lb_end;
  uint16_t hb_end;
  uint16_t lb_start;
  uint16_t hb_start;
  roaring_bitmap_t *ans;
  undefined6 in_stack_ffffffffffffff98;
  undefined2 in_stack_ffffffffffffff9e;
  roaring_array_t *in_stack_ffffffffffffffa0;
  roaring_array_t *prVar1;
  uint16_t uVar2;
  uint16_t lb_start_00;
  uint16_t hb_00;
  undefined6 in_stack_ffffffffffffffb8;
  undefined2 in_stack_ffffffffffffffbe;
  ushort uVar3;
  roaring_array_t *ans_arr;
  undefined4 local_2c;
  undefined2 local_26;
  undefined2 local_22;
  undefined8 local_8;
  
  if (in_EDX < in_ESI) {
    local_8 = &roaring_bitmap_copy((roaring_bitmap_t *)
                                   CONCAT26(in_stack_ffffffffffffffbe,in_stack_ffffffffffffffb8))->
               high_low_container;
  }
  else {
    local_8 = &roaring_bitmap_create()->high_low_container;
    prVar1 = local_8;
    cow = is_cow(in_RDI);
    roaring_bitmap_set_copy_on_write((roaring_bitmap_t *)prVar1,cow);
    local_22 = (ushort)(in_ESI >> 0x10);
    local_26 = (ushort)(in_EDX >> 0x10);
    uVar3 = local_22;
    ans_arr = local_8;
    is_cow(in_RDI);
    ra_append_copies_until
              (in_stack_ffffffffffffffa0,
               (roaring_array_t *)CONCAT26(in_stack_ffffffffffffff9e,in_stack_ffffffffffffff98),0,
               false);
    uVar2 = (uint16_t)((ulong)prVar1 >> 0x10);
    lb_start_00 = (uint16_t)((ulong)prVar1 >> 0x20);
    hb_00 = (uint16_t)((ulong)prVar1 >> 0x30);
    if (local_22 == local_26) {
      insert_flipped_container
                (ans_arr,(roaring_array_t *)CONCAT26(uVar3,in_stack_ffffffffffffffb8),hb_00,
                 lb_start_00,uVar2);
    }
    else {
      if ((short)in_ESI != 0) {
        insert_flipped_container
                  (ans_arr,(roaring_array_t *)CONCAT26(uVar3,in_stack_ffffffffffffffb8),hb_00,
                   lb_start_00,uVar2);
        local_22 = local_22 + 1;
      }
      if ((short)in_EDX != -1) {
        local_26 = local_26 - 1;
      }
      for (local_2c = (uint)local_22; uVar2 = (uint16_t)((ulong)prVar1 >> 0x30),
          local_2c <= local_26; local_2c = local_2c + 1) {
        insert_fully_flipped_container
                  (ans_arr,(roaring_array_t *)CONCAT26(uVar3,in_stack_ffffffffffffffb8),uVar2);
      }
      if ((short)in_EDX != -1) {
        insert_flipped_container
                  (ans_arr,(roaring_array_t *)CONCAT26(uVar3,in_stack_ffffffffffffffb8),uVar2,
                   (uint16_t)((ulong)prVar1 >> 0x20),(uint16_t)((ulong)prVar1 >> 0x10));
        local_26 = local_26 + 1;
      }
    }
    prVar1 = local_8;
    is_cow(in_RDI);
    ra_append_copies_after
              (prVar1,(roaring_array_t *)CONCAT26(local_26,in_stack_ffffffffffffff98),0,false);
  }
  return (roaring_bitmap_t *)local_8;
}

Assistant:

roaring_bitmap_t *roaring_bitmap_flip_closed(const roaring_bitmap_t *x1,
                                             uint32_t range_start,
                                             uint32_t range_end) {
    if (range_start > range_end) {
        return roaring_bitmap_copy(x1);
    }

    roaring_bitmap_t *ans = roaring_bitmap_create();
    roaring_bitmap_set_copy_on_write(ans, is_cow(x1));

    uint16_t hb_start = (uint16_t)(range_start >> 16);
    const uint16_t lb_start = (uint16_t)range_start;  // & 0xFFFF;
    uint16_t hb_end = (uint16_t)(range_end >> 16);
    const uint16_t lb_end = (uint16_t)range_end;  // & 0xFFFF;

    ra_append_copies_until(&ans->high_low_container, &x1->high_low_container,
                           hb_start, is_cow(x1));
    if (hb_start == hb_end) {
        insert_flipped_container(&ans->high_low_container,
                                 &x1->high_low_container, hb_start, lb_start,
                                 lb_end);
    } else {
        // start and end containers are distinct
        if (lb_start > 0) {
            // handle first (partial) container
            insert_flipped_container(&ans->high_low_container,
                                     &x1->high_low_container, hb_start,
                                     lb_start, 0xFFFF);
            ++hb_start;  // for the full containers.  Can't wrap.
        }

        if (lb_end != 0xFFFF) --hb_end;  // later we'll handle the partial block

        for (uint32_t hb = hb_start; hb <= hb_end; ++hb) {
            insert_fully_flipped_container(&ans->high_low_container,
                                           &x1->high_low_container,
                                           (uint16_t)hb);
        }

        // handle a partial final container
        if (lb_end != 0xFFFF) {
            insert_flipped_container(&ans->high_low_container,
                                     &x1->high_low_container, hb_end + 1, 0,
                                     lb_end);
            ++hb_end;
        }
    }
    ra_append_copies_after(&ans->high_low_container, &x1->high_low_container,
                           hb_end, is_cow(x1));
    return ans;
}